

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O1

void __thiscall
asmjit::ZoneTree<asmjit::JitAllocatorBlock>::remove<asmjit::Support::Compare<0u>>
          (ZoneTree<asmjit::JitAllocatorBlock> *this,ZoneTreeNode *node,Compare<0U> *cmp)

{
  ulong uVar1;
  ZoneTreeNode *pZVar2;
  ZoneTreeNode *pZVar3;
  ZoneTreeNode *pZVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  JitAllocatorBlock *pJVar8;
  byte *pbVar9;
  uintptr_t uVar10;
  ZoneTreeNode *pZVar11;
  ZoneTreeNode *pZVar12;
  ZoneTreeNode *save_1;
  ulong *puVar13;
  uintptr_t *puVar14;
  uint uVar15;
  ZoneTreeNode *save;
  ulong *puVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  ZoneTreeNode head;
  ZoneTreeNode local_58;
  ulong local_48;
  uintptr_t local_40;
  ZoneTree<asmjit::JitAllocatorBlock> *local_38;
  
  pZVar3 = &local_58;
  local_58._rbNodeData[0] = 0;
  local_38 = this;
  pJVar8 = this->_root;
  local_58._rbNodeData[1] = (uintptr_t)pJVar8;
  if (pJVar8 < (JitAllocatorBlock *)0x2) {
    pZVar4 = (ZoneTreeNode *)0x0;
    pZVar2 = (ZoneTreeNode *)0x0;
    pZVar12 = (ZoneTreeNode *)0x0;
  }
  else {
    puVar14 = local_58._rbNodeData + 1;
    uVar10 = node[2]._rbNodeData[1];
    pZVar2 = (ZoneTreeNode *)0x0;
    pZVar4 = (ZoneTreeNode *)0x0;
    local_40 = uVar10;
    uVar5 = 1;
    pZVar3 = &local_58;
    pZVar11 = (ZoneTreeNode *)0x0;
    do {
      pZVar12 = pZVar3;
      pZVar3 = (ZoneTreeNode *)((ulong)pJVar8 & 0xfffffffffffffffe);
      uVar15 = (uint)(uVar10 < pZVar3[2]._rbNodeData[1]) - (uint)(pZVar3[2]._rbNodeData[1] < uVar10)
      ;
      uVar1 = (ulong)(uVar15 >> 0x1f);
      if (pZVar3 == node) {
        pZVar2 = pZVar3;
        pZVar4 = pZVar11;
      }
      if (((pZVar3 == (ZoneTreeNode *)0x0) || ((pZVar3->_rbNodeData[0] & 1) == 0)) &&
         ((this = (ZoneTree<asmjit::JitAllocatorBlock> *)
                  (pZVar3->_rbNodeData[uVar1] & 0xfffffffffffffffe), (Target *)this == (Target *)0x0
          || (((ulong)((Target *)this)->_vptr_Target & 1) == 0)))) {
        uVar15 = ~uVar15 >> 0x1f;
        this = (ZoneTree<asmjit::JitAllocatorBlock> *)
               (pZVar3->_rbNodeData[uVar15] & 0xfffffffffffffffe);
        if ((Target *)this == (Target *)0x0) {
LAB_0011bbb8:
          bVar18 = uVar5 == 0;
          puVar16 = (ulong *)(pZVar12->_rbNodeData[bVar18] & 0xfffffffffffffffe);
          if (puVar16 != (ulong *)0x0) {
            this = (ZoneTree<asmjit::JitAllocatorBlock> *)(puVar16[bVar18] & 0xfffffffffffffffe);
            if ((((Target *)this == (Target *)0x0) ||
                (((ulong)((Target *)this)->_vptr_Target & 1) == 0)) &&
               (((byte *)(puVar16[uVar5] & 0xfffffffffffffffe) == (byte *)0x0 ||
                ((*(byte *)(puVar16[uVar5] & 0xfffffffffffffffe) & 1) == 0)))) {
              *(byte *)pZVar12->_rbNodeData = (byte)pZVar12->_rbNodeData[0] & 0xfe;
              *(byte *)puVar16 = (byte)*puVar16 | 1;
              *(byte *)pZVar3->_rbNodeData = (byte)pZVar3->_rbNodeData[0] | 1;
            }
            else {
              bVar19 = pZVar12 == (ZoneTreeNode *)pZVar11->_rbNodeData[1];
              pbVar9 = (byte *)(puVar16[uVar5] & 0xfffffffffffffffe);
              if ((pbVar9 == (byte *)0x0) || ((*pbVar9 & 1) == 0)) {
                puVar13 = (ulong *)(pZVar11->_rbNodeData[bVar19] & 0xfffffffffffffffe);
                if (((Target *)this != (Target *)0x0) &&
                   (((ulong)((Target *)this)->_vptr_Target & 1) != 0)) {
                  puVar7 = puVar16 + uVar5;
                  uVar10 = (ulong)pbVar9 | (ulong)((uint)pZVar12->_rbNodeData[bVar18] & 1);
                  puVar13 = puVar16;
                  goto LAB_0011bd04;
                }
              }
              else {
                local_48 = (ulong)(uVar5 != 0);
                puVar13 = (ulong *)(puVar16[local_48] & 0xfffffffffffffffe);
                uVar6 = (ulong)((uint)bVar18 * 8);
                puVar16[local_48] =
                     (ulong)((uint)puVar16[local_48] & 1) |
                     *(ulong *)((long)puVar13 + uVar6) & 0xfffffffffffffffe;
                *(ulong *)((long)puVar13 + uVar6) =
                     (ulong)((uint)*(undefined8 *)((long)puVar13 + uVar6) & 1) | (ulong)puVar16;
                *(byte *)puVar16 = (byte)*puVar16 | 1;
                *(byte *)puVar13 = (byte)*puVar13 & 0xfe;
                uVar17 = (ulong)((uint)*(undefined8 *)((long)pZVar12->_rbNodeData + uVar6) & 1);
                *(byte **)((long)pZVar12->_rbNodeData + uVar6) = (byte *)(uVar17 + (long)puVar13);
                puVar7 = puVar13 + uVar5;
                uVar10 = *puVar7 & 0xfffffffffffffffe | uVar17;
LAB_0011bd04:
                pZVar12->_rbNodeData[bVar18] = uVar10;
                *puVar7 = (ulong)((uint)*puVar7 & 1) | (ulong)pZVar12;
                *(byte *)pZVar12->_rbNodeData = (byte)pZVar12->_rbNodeData[0] | 1;
                *(byte *)puVar13 = (byte)*puVar13 & 0xfe;
                pZVar11->_rbNodeData[bVar19] =
                     (ulong)((uint)pZVar11->_rbNodeData[bVar19] & 1) | (ulong)puVar13;
              }
              *(byte *)pZVar3->_rbNodeData = (byte)pZVar3->_rbNodeData[0] | 1;
              uVar5 = *puVar13;
              *puVar13 = uVar5 | 1;
              pbVar9 = (byte *)(uVar5 & 0xfffffffffffffffe);
              *pbVar9 = *pbVar9 & 0xfe;
              this = (ZoneTree<asmjit::JitAllocatorBlock> *)puVar13[1];
              ((Target *)this)->_vptr_Target =
                   (_func_int **)((ulong)((Target *)this)->_vptr_Target & 0xfffffffffffffffe);
              uVar10 = local_40;
            }
          }
        }
        else if (((ulong)((Target *)this)->_vptr_Target & 1) == 0) {
          if (((Target *)this == (Target *)0x0) ||
             (((ulong)((Target *)this)->_vptr_Target & 1) == 0)) goto LAB_0011bbb8;
        }
        else {
          pZVar12 = (ZoneTreeNode *)(pZVar3->_rbNodeData[uVar15] & 0xfffffffffffffffe);
          pZVar3->_rbNodeData[uVar15] =
               (ulong)((uint)pZVar3->_rbNodeData[uVar15] & 1) |
               pZVar12->_rbNodeData[uVar1] & 0xfffffffffffffffe;
          pZVar12->_rbNodeData[uVar1] =
               (ulong)((uint)pZVar12->_rbNodeData[uVar1] & 1) | (ulong)pZVar3;
          *(byte *)pZVar3->_rbNodeData = (byte)pZVar3->_rbNodeData[0] | 1;
          *(byte *)pZVar12->_rbNodeData = (byte)pZVar12->_rbNodeData[0] & 0xfe;
          this = (ZoneTree<asmjit::JitAllocatorBlock> *)
                 ((ulong)((uint)*puVar14 & 1) | (ulong)pZVar12);
          *puVar14 = (uintptr_t)this;
        }
      }
      puVar14 = pZVar3->_rbNodeData + uVar1;
      pJVar8 = (JitAllocatorBlock *)*puVar14;
      uVar5 = uVar1;
      pZVar11 = pZVar12;
    } while ((JitAllocatorBlock *)0x1 < pJVar8);
  }
  if (pZVar2 == (ZoneTreeNode *)0x0) {
LAB_0011be77:
    remove<asmjit::Support::Compare<0u>>();
LAB_0011be7c:
    remove<asmjit::Support::Compare<0u>>();
  }
  else {
    if (pZVar2 == &local_58) goto LAB_0011be7c;
    if (pZVar3 != &local_58) {
      this = (ZoneTree<asmjit::JitAllocatorBlock> *)
             (ulong)(pZVar3 == (ZoneTreeNode *)pZVar12->_rbNodeData[1]);
      pZVar12->_rbNodeData[(long)this] =
           (ulong)((uint)pZVar12->_rbNodeData[(long)this] & 1) |
           pZVar3->_rbNodeData[pZVar3->_rbNodeData[0] < 2] & 0xfffffffffffffffe;
      if (pZVar2 == pZVar3) {
LAB_0011be4e:
        local_38->_root = (JitAllocatorBlock *)local_58._rbNodeData[1];
        if ((JitAllocatorBlock *)local_58._rbNodeData[1] != (JitAllocatorBlock *)0x0) {
          *(byte *)(((ZoneTreeNodeT<asmjit::JitAllocatorBlock> *)local_58._rbNodeData[1])->
                   super_ZoneTreeNode)._rbNodeData =
               (byte)(((ZoneTreeNodeT<asmjit::JitAllocatorBlock> *)local_58._rbNodeData[1])->
                     super_ZoneTreeNode)._rbNodeData[0] & 0xfe;
        }
        return;
      }
      if (pZVar2 != pZVar4) {
        pZVar12 = pZVar4;
        if (pZVar4 == (ZoneTreeNode *)0x0) {
          pZVar12 = &local_58;
        }
        if (pZVar12 == &local_58) {
          uVar5 = 1;
        }
        else {
          pZVar11 = &local_58;
          if (pZVar4 != (ZoneTreeNode *)0x0) {
            pZVar11 = pZVar4;
          }
          uVar5 = (ulong)(pZVar11[2]._rbNodeData[1] < node[2]._rbNodeData[1]);
        }
        this = (ZoneTree<asmjit::JitAllocatorBlock> *)pZVar12->_rbNodeData[uVar5];
        while (pZVar4 = (ZoneTreeNode *)((ulong)this & 0xfffffffffffffffe), pZVar2 != pZVar4) {
          if (pZVar4 == (ZoneTreeNode *)0x0) {
            remove<asmjit::Support::Compare<0u>>();
            goto LAB_0011be77;
          }
          uVar5 = (ulong)(pZVar4[2]._rbNodeData[1] < node[2]._rbNodeData[1]);
          pZVar12 = pZVar4;
          this = (ZoneTree<asmjit::JitAllocatorBlock> *)pZVar4->_rbNodeData[uVar5];
        }
        pZVar12->_rbNodeData[uVar5] = (ulong)((uint)this & 1) | (ulong)pZVar3;
        pZVar3->_rbNodeData[0] = pZVar2->_rbNodeData[0];
        pZVar3->_rbNodeData[1] = pZVar2->_rbNodeData[1];
        goto LAB_0011be4e;
      }
      goto LAB_0011be86;
    }
  }
  remove<asmjit::Support::Compare<0u>>();
LAB_0011be86:
  remove<asmjit::Support::Compare<0u>>();
  Target::Target((Target *)this);
  ((Target *)this)->_vptr_Target = (_func_int **)&PTR__JitRuntime_00159760;
  JitAllocator::JitAllocator((JitAllocator *)((long)this + 0x10),(CreateParams *)node);
  (((Target *)this)->_environment)._arch = '\x02';
  (((Target *)this)->_environment)._subArch = '\0';
  (((Target *)this)->_environment)._vendor = '\0';
  (((Target *)this)->_environment)._platform = '\x03';
  (((Target *)this)->_environment)._abi = '\x02';
  (((Target *)this)->_environment)._format = '\0';
  (((Target *)this)->_environment)._reserved = 0;
  (((Target *)this)->_environment)._format = '\x01';
  return;
}

Assistant:

inline ZoneTreeNode() noexcept
    : _rbNodeData { 0, 0 } {}